

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

int Gia_ManDupConeBack(Gia_Man_t *p,Gia_Man_t *pNew,Vec_Int_t *vCiIds)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pObj_00;
  bool bVar5;
  int local_34;
  int i;
  Gia_Obj_t *pRoot;
  Gia_Obj_t *pObj;
  Vec_Int_t *vCiIds_local;
  Gia_Man_t *pNew_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManCiNum(pNew);
  iVar2 = Vec_IntSize(vCiIds);
  if (iVar1 == iVar2) {
    Gia_ManFillValue(pNew);
    pGVar4 = Gia_ManConst0(pNew);
    pGVar4->Value = 0;
    local_34 = 0;
    while( true ) {
      iVar1 = Vec_IntSize(pNew->vCis);
      bVar5 = false;
      if (local_34 < iVar1) {
        pRoot = Gia_ManCi(pNew,local_34);
        bVar5 = pRoot != (Gia_Obj_t *)0x0;
      }
      if (!bVar5) break;
      iVar1 = Vec_IntEntry(vCiIds,local_34);
      pGVar4 = Gia_ManCi(p,iVar1);
      uVar3 = Gia_Obj2Lit(p,pGVar4);
      pRoot->Value = uVar3;
      local_34 = local_34 + 1;
    }
    pGVar4 = Gia_ManCo(pNew,0);
    pObj_00 = Gia_ObjFanin0(pGVar4);
    Gia_ManDupConeBack_rec(p,pNew,pObj_00);
    iVar1 = Gia_ObjFanin0Copy(pGVar4);
    return iVar1;
  }
  __assert_fail("Gia_ManCiNum(pNew) == Vec_IntSize(vCiIds)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                ,0x7e2,"int Gia_ManDupConeBack(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

int Gia_ManDupConeBack( Gia_Man_t * p, Gia_Man_t * pNew, Vec_Int_t * vCiIds )
{
    Gia_Obj_t * pObj, * pRoot; int i;
    assert( Gia_ManCiNum(pNew) == Vec_IntSize(vCiIds) );
    Gia_ManFillValue(pNew);
    Gia_ManConst0(pNew)->Value = 0;
    Gia_ManForEachCi( pNew, pObj, i )
        pObj->Value = Gia_Obj2Lit( p, Gia_ManCi(p, Vec_IntEntry(vCiIds, i)) );
    pRoot = Gia_ManCo(pNew, 0);
    Gia_ManDupConeBack_rec( p, pNew, Gia_ObjFanin0(pRoot) );
    return Gia_ObjFanin0Copy(pRoot);
}